

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  short nRow;
  WhereLoop *pTemplate;
  WhereInfo *pWVar1;
  Table *pTVar2;
  WhereClause *pWC_00;
  short sVar3;
  u8 uVar4;
  LogEst a;
  LogEst LVar5;
  LogEst LVar6;
  int iVar7;
  int iVar8;
  SrcList_item *pSrc_00;
  WhereTerm *pWVar9;
  u32 uVar10;
  Bitmask local_158;
  u8 local_14c;
  u8 local_148;
  WhereTerm *pTerm_1;
  WhereClause *pWC2;
  int local_128;
  int iCur;
  int ii;
  LogEst nLookup;
  Bitmask m;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  Index *pFirst;
  Table *pTab;
  WhereClause *pWC;
  LogEst rLogSize;
  LogEst rSize;
  int b;
  int iSortIdx;
  int rc;
  WhereLoop *pNew;
  SrcList_item *pSrc;
  SrcList *pTabList;
  undefined1 local_c0 [2];
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  Index *pProbe;
  WhereInfo *pWInfo;
  Bitmask mPrereq_local;
  WhereLoopBuilder *pBuilder_local;
  
  b = 0;
  uVar4 = '\x01';
  pTemplate = pBuilder->pNew;
  pWVar1 = pBuilder->pWInfo;
  pSrc_00 = pWVar1->pTabList->a + (int)(uint)pTemplate->iTab;
  pTVar2 = pSrc_00->pTab;
  pWC_00 = pBuilder->pWC;
  if (pSrc_00->pIBIndex == (Index *)0x0) {
    if ((pTVar2->tabFlags & 0x20) == 0) {
      memset(local_c0,0,0x98);
      sPk.colNotIdxed = (Bitmask)local_c0;
    }
    else {
      sPk.colNotIdxed = (Bitmask)pTVar2->pIndex;
    }
  }
  else {
    sPk.colNotIdxed = (Bitmask)pSrc_00->pIBIndex;
  }
  LVar6 = pTVar2->nRowLogEst;
  a = estLog(LVar6);
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) && ((pWVar1->wctrlFlags & 0x20) == 0)) &&
      ((pWVar1->pParse->db->flags & 0x8000) != 0)) &&
     (((pSrc_00->pIBIndex == (Index *)0x0 && (((pSrc_00->fg).field_0x1 & 1) == 0)) &&
      (((pTVar2->tabFlags & 0x20) == 0 &&
       ((((byte)(pSrc_00->fg).field_0x1 >> 3 & 1) == 0 &&
        (((byte)(pSrc_00->fg).field_0x1 >> 5 & 1) == 0)))))))) {
    pWVar9 = pWC_00->a;
    iVar7 = pWC_00->nTerm;
    for (pWCEnd = pWC_00->a; b == 0 && pWCEnd < pWVar9 + iVar7; pWCEnd = pWCEnd + 1) {
      if (((pWCEnd->prereqRight & pTemplate->maskSelf) == 0) &&
         (iVar8 = termCanDriveIndex(pWCEnd,pSrc_00,0), iVar8 != 0)) {
        (pTemplate->u).btree.nEq = 1;
        pTemplate->nSkip = 0;
        (pTemplate->u).btree.pIndex = (Index *)0x0;
        pTemplate->nLTerm = 1;
        *pTemplate->aLTerm = pWCEnd;
        pTemplate->rSetup = a + LVar6;
        if ((pTVar2->pSelect == (Select *)0x0) && ((pTVar2->tabFlags & 2) == 0)) {
          pTemplate->rSetup = pTemplate->rSetup + 0x1c;
        }
        else {
          pTemplate->rSetup = pTemplate->rSetup + -10;
        }
        if (pTemplate->rSetup < 0) {
          pTemplate->rSetup = 0;
        }
        pTemplate->nOut = 0x2b;
        LVar5 = sqlite3LogEstAdd(a,pTemplate->nOut);
        pTemplate->rRun = LVar5;
        pTemplate->wsFlags = 0x4000;
        pTemplate->prereq = mPrereq | pWCEnd->prereqRight;
        b = whereLoopInsert(pBuilder,pTemplate);
      }
    }
  }
  do {
    if (b != 0 || sPk.colNotIdxed == 0) {
      return b;
    }
    if (((*(long *)(sPk.colNotIdxed + 0x48) == 0) ||
        (iVar7 = whereUsablePartialIndex(pSrc_00->iCursor,pWC_00,*(Expr **)(sPk.colNotIdxed + 0x48))
        , iVar7 != 0)) && ((*(ushort *)(sPk.colNotIdxed + 99) >> 8 & 1) == 0)) {
      nRow = **(short **)(sPk.colNotIdxed + 0x10);
      (pTemplate->u).btree.nEq = 0;
      (pTemplate->u).btree.nBtm = 0;
      (pTemplate->u).btree.nTop = 0;
      pTemplate->nSkip = 0;
      pTemplate->nLTerm = 0;
      pTemplate->iSortIdx = '\0';
      pTemplate->rSetup = 0;
      pTemplate->prereq = mPrereq;
      pTemplate->nOut = nRow;
      (pTemplate->u).btree.pIndex = (Index *)sPk.colNotIdxed;
      iVar7 = indexMightHelpWithOrderBy(pBuilder,(Index *)sPk.colNotIdxed,pSrc_00->iCursor);
      if ((*(ushort *)(sPk.colNotIdxed + 99) & 3) == 3) {
        pTemplate->wsFlags = 0x100;
        local_148 = uVar4;
        if (iVar7 == 0) {
          local_148 = '\0';
        }
        pTemplate->iSortIdx = local_148;
        pTemplate->rRun = nRow + 0x10;
        whereLoopOutputAdjust(pWC_00,pTemplate,nRow);
        iVar7 = whereLoopInsert(pBuilder,pTemplate);
        pTemplate->nOut = nRow;
joined_r0x001b0709:
        if (iVar7 != 0) {
          return iVar7;
        }
      }
      else {
        if ((*(ushort *)(sPk.colNotIdxed + 99) >> 5 & 1) == 0) {
          _ii = pSrc_00->colUsed & *(ulong *)(sPk.colNotIdxed + 0x90);
          uVar10 = 0x200;
          if (_ii == 0) {
            uVar10 = 0x240;
          }
          pTemplate->wsFlags = uVar10;
        }
        else {
          pTemplate->wsFlags = 0x240;
          _ii = 0;
        }
        if ((((iVar7 != 0) || ((pTVar2->tabFlags & 0x20) != 0)) ||
            (*(long *)(sPk.colNotIdxed + 0x48) != 0)) ||
           (((_ii == 0 && ((*(ushort *)(sPk.colNotIdxed + 99) >> 2 & 1) == 0)) &&
            ((*(short *)(sPk.colNotIdxed + 0x5c) < pTVar2->szTabRow &&
             ((((pWVar1->wctrlFlags & 4) == 0 && (sqlite3Config.bUseCis != 0)) &&
              ((pWVar1->pParse->db->dbOptFlags & 0x20) == 0)))))))) {
          local_14c = uVar4;
          if (iVar7 == 0) {
            local_14c = '\0';
          }
          pTemplate->iSortIdx = local_14c;
          pTemplate->rRun =
               nRow + 1 +
               (short)((*(short *)(sPk.colNotIdxed + 0x5c) * 0xf) / (int)pTVar2->szTabRow);
          if (_ii != 0) {
            iCur._2_2_ = nRow + 0x10;
            iVar7 = pSrc_00->iCursor;
            for (local_128 = 0; local_128 < (pWVar1->sWC).nTerm; local_128 = local_128 + 1) {
              pWVar9 = (pWVar1->sWC).a + local_128;
              iVar8 = sqlite3ExprCoveredByIndex(pWVar9->pExpr,iVar7,(Index *)sPk.colNotIdxed);
              if (iVar8 == 0) break;
              if (pWVar9->truthProb < 1) {
                sVar3 = iCur._2_2_ + pWVar9->truthProb;
              }
              else {
                sVar3 = iCur._2_2_ + -1;
                if ((pWVar9->eOperator & 0x82) != 0) {
                  sVar3 = iCur._2_2_ + -0x14;
                }
              }
              iCur._2_2_ = sVar3;
            }
            LVar6 = sqlite3LogEstAdd(pTemplate->rRun,iCur._2_2_);
            pTemplate->rRun = LVar6;
          }
          whereLoopOutputAdjust(pWC_00,pTemplate,nRow);
          iVar7 = whereLoopInsert(pBuilder,pTemplate);
          pTemplate->nOut = nRow;
          goto joined_r0x001b0709;
        }
      }
      pBuilder->bldFlags = 0;
      b = whereLoopAddBtreeIndex(pBuilder,pSrc_00,(Index *)sPk.colNotIdxed,0);
      if (pBuilder->bldFlags == 1) {
        pTVar2->tabFlags = pTVar2->tabFlags | 0x100;
      }
      sqlite3Stat4ProbeFree(pBuilder->pRec);
      pBuilder->nRecValid = 0;
      pBuilder->pRec = (UnpackedRecord *)0x0;
    }
    if (pSrc_00->pIBIndex == (Index *)0x0) {
      local_158 = *(Bitmask *)(sPk.colNotIdxed + 0x28);
    }
    else {
      local_158 = 0;
    }
    sPk.colNotIdxed = local_158;
    uVar4 = uVar4 + '\x01';
  } while( true );
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 10;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only 
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe; 
      pProbe=(pSrc->pIBIndex ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}